

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

ssize_t __thiscall
kj::ReadableDirectory::readlink(ReadableDirectory *this,char *__path,char *__buf,size_t __len)

{
  NullableValue<kj::String> *other;
  String *pSVar1;
  char (*params) [2];
  Fault local_90;
  Fault f;
  Maybe<kj::String> local_68;
  undefined1 local_48 [8];
  NullableValue<kj::String> p;
  ReadableDirectory *this_local;
  PathPtr path_local;
  
  p.field_1.value.content.disposer = (ArrayDisposer *)__path;
  this_local = (ReadableDirectory *)__buf;
  path_local.parts.ptr = (String *)__len;
  path_local.parts.size_ = (size_t)this;
  (**(code **)(*(long *)__path + 0x60))(&local_68,__path,__buf,__len);
  other = _::readMaybe<kj::String>(&local_68);
  _::NullableValue<kj::String>::NullableValue((NullableValue<kj::String> *)local_48,other);
  Maybe<kj::String>::~Maybe(&local_68);
  pSVar1 = _::NullableValue::operator_cast_to_String_((NullableValue *)local_48);
  if (pSVar1 == (String *)0x0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[14],kj::PathPtr&>
              (&local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x239,FAILED,(char *)0x0,"\"not a symlink\", path",(char (*) [14])"not a symlink",
               (PathPtr *)&this_local);
    f.exception._0_4_ = 2;
    _::Debug::Fault::~Fault(&local_90);
    str<char_const(&)[2]>((String *)this,(kj *)0x678e38,params);
  }
  else {
    pSVar1 = _::NullableValue<kj::String>::operator*((NullableValue<kj::String> *)local_48);
    pSVar1 = mv<kj::String>(pSVar1);
    String::String((String *)this,pSVar1);
  }
  f.exception._0_4_ = 1;
  _::NullableValue<kj::String>::~NullableValue((NullableValue<kj::String> *)local_48);
  return (ssize_t)this;
}

Assistant:

String ReadableDirectory::readlink(PathPtr path) const {
  KJ_IF_MAYBE(p, tryReadlink(path)) {
    return kj::mv(*p);
  } else {
    KJ_FAIL_REQUIRE("not a symlink", path) { break; }